

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O1

int __thiscall
ncnn::Crop::forward(Crop *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  Mat *src;
  int *piVar2;
  size_t sVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  Mat *this_00;
  void *pvVar10;
  int iVar11;
  int _w;
  Option *pOVar12;
  int ref_h;
  int _h;
  size_t _elemsize;
  undefined1 *__src;
  void *__src_00;
  bool bVar13;
  int channels;
  Mat m;
  Mat m_1;
  int local_170;
  int local_16c;
  uint local_168;
  ulong local_160;
  Mat local_158;
  Option *local_110;
  void *local_108;
  int *local_100;
  void *local_f8;
  int local_f0;
  Allocator *local_e8;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  uint local_d0;
  ulong local_c8;
  uint local_bc;
  size_t local_b8;
  long local_b0;
  Mat local_a8;
  Mat *local_58;
  undefined1 *local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  iVar4 = src->w;
  iVar9 = src->h;
  iVar1 = src->dims;
  _elemsize = src->elemsize;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_110 = opt;
  local_b8 = _elemsize;
  if (this->woffset == -0xe9) {
    iVar11 = 0;
    if (iVar1 - 1U < 4) {
      iVar11 = iVar1;
    }
    uVar8 = 0xffffffff;
    if (iVar11 - 1U < 4) {
      piVar2 = (int *)src[1].data;
      switch(iVar11) {
      case 1:
        local_170 = *piVar2;
        _w = piVar2[3];
        _h = -1;
        iVar11 = -1;
        break;
      case 2:
        local_170 = *piVar2;
        local_16c = piVar2[1];
        _w = piVar2[3];
        _h = piVar2[4];
        iVar11 = -1;
        break;
      case 3:
        local_170 = *piVar2;
        local_16c = piVar2[1];
        iVar11 = piVar2[2];
        _w = piVar2[3];
        _h = piVar2[4];
        local_168 = piVar2[5];
        break;
      case 4:
        local_170 = *piVar2;
        local_16c = piVar2[1];
        local_b0 = CONCAT44(local_b0._4_4_,piVar2[2]);
        iVar11 = piVar2[3];
        _w = piVar2[4];
        _h = piVar2[5];
        uVar8 = piVar2[6];
        local_168 = piVar2[7];
      }
    }
    else {
      _w = -1;
      _h = -1;
      iVar11 = -1;
    }
  }
  else {
    uVar8 = src->dims;
    switch(uVar8) {
    case 1:
      local_168 = uVar8;
      break;
    case 2:
      local_168 = 1;
      break;
    case 3:
      uVar8 = 3;
      local_168 = src->elempack * src->c;
      break;
    case 4:
      uVar8 = 4;
      local_168 = src->elempack * src->c;
      break;
    default:
      uVar8 = 0;
      local_168 = 0;
    }
    switch(src[1].dims) {
    case 1:
      iVar11 = src[1].elempack * src[1].w;
      break;
    case 2:
      iVar11 = src[1].w;
      break;
    case 3:
      iVar11 = src[1].w;
      break;
    case 4:
      iVar11 = src[1].w;
      break;
    default:
      iVar11 = 0;
    }
    if (uVar8 - 1 < 4) {
      iVar4 = (*(code *)(&DAT_00317cd0 + *(int *)(&DAT_00317cd0 + (ulong)(uVar8 - 1) * 4)))
                        (this,iVar11,
                         &DAT_00317cd0 + *(int *)(&DAT_00317cd0 + (ulong)(uVar8 - 1) * 4));
      return iVar4;
    }
    _w = -1;
    _h = -1;
    iVar11 = -1;
    uVar8 = 0xffffffff;
    local_170 = this->woffset;
  }
  local_d0 = local_168;
  switch(iVar1) {
  case 1:
    if (_w != iVar4) {
      Mat::create(this_00,_w,_elemsize,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (_elemsize == 4) {
        copy_cut_border_image<float>(src,this_00,0,local_170);
        return 0;
      }
      if (_elemsize == 2) {
        copy_cut_border_image<unsigned_short>(src,this_00,0,local_170);
        return 0;
      }
      if (_elemsize == 1) {
        copy_cut_border_image<signed_char>(src,this_00,0,local_170);
        return 0;
      }
      return 0;
    }
    break;
  case 2:
    if ((_w != iVar4) || (_h != iVar9)) {
      Mat::create(this_00,_w,_h,_elemsize,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (_elemsize == 4) {
        copy_cut_border_image<float>(src,this_00,local_16c,local_170);
        return 0;
      }
      if (_elemsize != 2) {
        if (_elemsize != 1) {
          return 0;
        }
        copy_cut_border_image<signed_char>(src,this_00,local_16c,local_170);
        return 0;
      }
      copy_cut_border_image<unsigned_short>(src,this_00,local_16c,local_170);
      return 0;
    }
    break;
  case 3:
    bVar13 = iVar9 != _h || iVar4 != _w;
    if ((bVar13) || (local_168 != src->c)) {
      local_dc = src->w;
      local_d8 = src->h;
      if (src->dims == 3) {
        local_f8 = (void *)src->elemsize;
        local_108 = (void *)((long)iVar11 * src->cstep * (long)local_f8 + (long)src->data);
        local_f0 = src->elempack;
        local_e8 = src->allocator;
        local_e0 = 3;
        local_d4 = 1;
        lVar5 = (long)local_d8 * (long)local_dc * (long)local_f8;
      }
      else {
        local_f8 = (void *)src->elemsize;
        local_108 = (void *)((long)iVar11 * src->cstep * (long)local_f8 + (long)src->data);
        local_d4 = src->d;
        local_f0 = src->elempack;
        local_e8 = src->allocator;
        local_e0 = 4;
        lVar5 = (long)local_d8 * (long)local_dc * (long)local_d4 * (long)local_f8;
      }
      local_100 = (int *)0x0;
      local_c8 = (lVar5 + 0xfU & 0xfffffffffffffff0) / (ulong)local_f8;
      if (bVar13) {
        Mat::create(this_00,_w,_h,local_168,_elemsize,opt->blob_allocator);
        iVar4 = -100;
        if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          if (0 < (int)local_168) {
            local_b0 = (long)local_16c;
            local_50 = (undefined1 *)(long)local_170;
            uVar7 = 0;
            local_58 = this_00;
            do {
              local_158.elemsize._4_4_ = (undefined4)((ulong)local_f8 >> 0x20);
              if (local_e0 == 3) {
                local_158.dims = 2;
                local_158.c = 1;
              }
              else {
                local_158.dims = 3;
                local_158.c = local_d4;
              }
              local_158.data = (void *)(local_c8 * uVar7 * (long)local_f8 + (long)local_108);
              local_158.d = 1;
              local_158.w = local_dc;
              local_158.allocator = local_e8;
              local_158.elempack = local_f0;
              local_158.elemsize._0_4_ = SUB84(local_f8,0);
              local_158.refcount._4_4_ = 0;
              local_158.refcount._0_4_ = 0;
              local_158.h = local_d8;
              local_158.cstep = (long)local_d8 * (long)local_dc;
              if (this_00->dims == 3) {
                uVar8 = this_00->w;
                sVar3 = this_00->elemsize;
                local_a8.data = (void *)(this_00->cstep * uVar7 * sVar3 + (long)this_00->data);
                iVar4 = this_00->h;
                local_a8.elempack = this_00->elempack;
                local_a8.allocator = this_00->allocator;
                local_a8.elemsize._0_4_ = (undefined4)sVar3;
                local_a8.elemsize._4_4_ = (undefined4)(sVar3 >> 0x20);
                local_a8.dims = 2;
                local_a8.c = 1;
              }
              else {
                uVar8 = this_00->w;
                iVar4 = this_00->h;
                local_a8.c = this_00->d;
                sVar3 = this_00->elemsize;
                local_a8.data = (void *)(this_00->cstep * uVar7 * sVar3 + (long)this_00->data);
                local_a8.elempack = this_00->elempack;
                local_a8.allocator = this_00->allocator;
                local_a8.elemsize._0_4_ = (undefined4)sVar3;
                local_a8.elemsize._4_4_ = (undefined4)(sVar3 >> 0x20);
                local_a8.dims = 3;
              }
              local_a8.d = 1;
              local_a8.refcount._4_4_ = 0;
              local_a8.refcount._0_4_ = 0;
              local_a8.cstep = (long)iVar4 * (long)(int)uVar8;
              local_a8.h = iVar4;
              local_a8.w = uVar8;
              if (_elemsize == 4) {
LAB_001bcc74:
                copy_cut_border_image<float>(&local_158,&local_a8,local_16c,local_170);
              }
              else if (_elemsize == 2) {
LAB_001bcc57:
                copy_cut_border_image<unsigned_short>(&local_158,&local_a8,local_16c,local_170);
                if (_elemsize == 4) goto LAB_001bcc74;
              }
              else if (_elemsize == 1) {
                if (0 < iVar4) {
                  pOVar12 = (Option *)(long)(int)uVar8;
                  lVar5 = (long)local_dc;
                  __src = (undefined1 *)
                          ((long)(lVar5 * local_b0 * (long)local_f8 + (long)local_158.data) +
                          (long)local_50);
                  iVar9 = 0;
                  pvVar10 = local_a8.data;
                  local_110 = pOVar12;
                  do {
                    if ((int)uVar8 < 0xc) {
                      if (0 < (int)pOVar12) {
                        uVar6 = 0;
                        do {
                          *(undefined1 *)((long)pvVar10 + uVar6) = __src[uVar6];
                          uVar6 = uVar6 + 1;
                        } while (uVar8 != uVar6);
                      }
                    }
                    else {
                      memcpy(pvVar10,__src,(ulong)uVar8);
                      pOVar12 = local_110;
                    }
                    pvVar10 = (void *)((long)pvVar10 + (long)pOVar12);
                    __src = __src + lVar5;
                    iVar9 = iVar9 + 1;
                  } while (iVar9 != iVar4);
                }
                this_00 = local_58;
                _elemsize = local_b8;
                if (local_b8 == 4) goto LAB_001bcc74;
                if (local_b8 == 2) goto LAB_001bcc57;
              }
              piVar2 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (*piVar2 == 0) {
                  if (local_a8.allocator == (Allocator *)0x0) {
                    if (local_a8.data != (void *)0x0) {
                      free(local_a8.data);
                    }
                  }
                  else {
                    (*(local_a8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_a8.cstep = 0;
              local_a8.data = (void *)0x0;
              local_a8.refcount._0_4_ = 0;
              local_a8.refcount._4_4_ = 0;
              local_a8.elemsize._0_4_ = 0;
              local_a8.elemsize._4_4_ = 0;
              local_a8.elempack = 0;
              local_a8.dims = 0;
              local_a8.w = 0;
              local_a8.h = 0;
              local_a8.d = 0;
              local_a8.c = 0;
              piVar2 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (*piVar2 == 0) {
                  if (local_158.allocator == (Allocator *)0x0) {
                    if (local_158.data != (void *)0x0) {
                      free(local_158.data);
                    }
                  }
                  else {
                    (*(local_158.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_158.cstep = 0;
              local_158.data = (void *)0x0;
              local_158.refcount._0_4_ = 0;
              local_158.refcount._4_4_ = 0;
              local_158.elemsize._0_4_ = 0;
              local_158.elemsize._4_4_ = 0;
              local_158.elempack = 0;
              local_158.dims = 0;
              local_158.w = 0;
              local_158.h = 0;
              local_158.d = 0;
              local_158.c = 0;
              uVar7 = uVar7 + 1;
            } while (uVar7 != local_168);
          }
          iVar4 = 0;
        }
      }
      else {
        Mat::clone(&local_158,(__fn *)&local_108,(void *)0x0,local_168,local_f8);
        if (this_00 != &local_158) {
          piVar2 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + 1;
            UNLOCK();
          }
          piVar2 = this_00->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (this_00->allocator == (Allocator *)0x0) {
                if (this_00->data != (void *)0x0) {
                  free(this_00->data);
                }
              }
              else {
                (*this_00->allocator->_vptr_Allocator[3])();
              }
            }
          }
          this_00->cstep = 0;
          this_00->data = (void *)0x0;
          this_00->refcount = (int *)0x0;
          *(undefined8 *)((long)&this_00->refcount + 4) = 0;
          *(undefined8 *)((long)&this_00->elemsize + 4) = 0;
          this_00->dims = 0;
          this_00->w = 0;
          this_00->h = 0;
          this_00->d = 0;
          this_00->c = 0;
          this_00->data = local_158.data;
          this_00->refcount = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
          this_00->elemsize = CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
          this_00->elempack = local_158.elempack;
          this_00->allocator = local_158.allocator;
          this_00->dims = local_158.dims;
          this_00->w = local_158.w;
          this_00->h = local_158.h;
          this_00->d = local_158.d;
          this_00->c = local_158.c;
          this_00->cstep = local_158.cstep;
        }
        piVar2 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (local_158.allocator == (Allocator *)0x0) {
              if (local_158.data != (void *)0x0) {
                free(local_158.data);
              }
            }
            else {
              (*(local_158.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (this_00->data == (void *)0x0) {
          iVar4 = -100;
        }
        else {
          iVar4 = -100;
          if ((long)this_00->c * this_00->cstep != 0) {
            iVar4 = 0;
          }
        }
      }
      if (local_100 == (int *)0x0) {
        return iVar4;
      }
      LOCK();
      *local_100 = *local_100 + -1;
      UNLOCK();
      if (*local_100 != 0) {
        return iVar4;
      }
      if (local_e8 != (Allocator *)0x0) {
        (*local_e8->_vptr_Allocator[3])();
        return iVar4;
      }
LAB_001bd4f9:
      if (local_108 != (void *)0x0) {
        free(local_108);
        return iVar4;
      }
      return iVar4;
    }
    goto LAB_001bc661;
  case 4:
    bVar13 = src->d != uVar8;
    if ((bVar13 || (iVar9 != _h || iVar4 != _w)) || (local_168 != src->c)) {
      local_dc = src->w;
      local_d8 = src->h;
      if (src->dims == 3) {
        local_f8 = (void *)src->elemsize;
        local_108 = (void *)((long)iVar11 * src->cstep * (long)local_f8 + (long)src->data);
        local_f0 = src->elempack;
        local_e8 = src->allocator;
        local_e0 = 3;
        local_d4 = 1;
        lVar5 = (long)local_d8 * (long)local_dc * (long)local_f8;
      }
      else {
        local_f8 = (void *)src->elemsize;
        local_108 = (void *)((long)iVar11 * src->cstep * (long)local_f8 + (long)src->data);
        local_d4 = src->d;
        local_f0 = src->elempack;
        local_e8 = src->allocator;
        local_e0 = 4;
        lVar5 = (long)local_d8 * (long)local_dc * (long)local_d4 * (long)local_f8;
      }
      local_100 = (int *)0x0;
      local_c8 = (lVar5 + 0xfU & 0xfffffffffffffff0) / (ulong)local_f8;
      local_bc = uVar8;
      if (bVar13 || (iVar9 != _h || iVar4 != _w)) {
        Mat::create(this_00,_w,_h,uVar8,local_168,_elemsize,opt->blob_allocator);
        iVar4 = -100;
        if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          if (0 < (int)local_168) {
            local_38 = (long)local_16c;
            local_40 = (long)local_170;
            local_b0 = (long)(int)local_b0;
            local_48 = (ulong)local_168;
            local_50 = (undefined1 *)(ulong)local_bc;
            local_160 = 0;
            local_58 = this_00;
            do {
              if (0 < (int)local_bc) {
                pOVar12 = (Option *)0x0;
                do {
                  local_158.cstep = (long)local_d8 * (long)local_dc;
                  local_158.data =
                       (void *)((long)local_108 +
                               (long)(&pOVar12->lightmode + local_b0) * (long)local_f8 *
                               local_158.cstep + local_c8 * local_160 * (long)local_f8);
                  local_158.refcount._0_4_ = 0;
                  local_158.refcount._4_4_ = 0;
                  local_158.elemsize._0_4_ = SUB84(local_f8,0);
                  local_158.elemsize._4_4_ = (undefined4)((ulong)local_f8 >> 0x20);
                  local_158.elempack = local_f0;
                  local_158.allocator = local_e8;
                  local_158.w = local_dc;
                  local_158.dims = 2;
                  local_158.h = local_d8;
                  local_158.d = 1;
                  local_158.c = 1;
                  sVar3 = this_00->elemsize;
                  local_a8.elempack = this_00->elempack;
                  iVar4 = this_00->h;
                  uVar8 = this_00->w;
                  local_a8.cstep = (long)iVar4 * (long)(int)uVar8;
                  pvVar10 = (void *)((long)this_00->data +
                                    (long)pOVar12 * sVar3 * local_a8.cstep +
                                    this_00->cstep * local_160 * sVar3);
                  local_a8.allocator = this_00->allocator;
                  local_a8.refcount._0_4_ = 0;
                  local_a8.refcount._4_4_ = 0;
                  local_a8.elemsize._0_4_ = (undefined4)sVar3;
                  local_a8.elemsize._4_4_ = (undefined4)(sVar3 >> 0x20);
                  local_a8.w = uVar8;
                  local_a8.dims = 2;
                  local_a8.d = 1;
                  local_a8.c = 1;
                  local_110 = pOVar12;
                  local_a8.data = pvVar10;
                  local_a8.h = iVar4;
                  if (_elemsize == 4) {
LAB_001bd135:
                    copy_cut_border_image<float>(&local_158,&local_a8,local_16c,local_170);
                  }
                  else if (_elemsize == 2) {
LAB_001bd115:
                    copy_cut_border_image<unsigned_short>(&local_158,&local_a8,local_16c,local_170);
                    if (_elemsize == 4) goto LAB_001bd135;
                  }
                  else if (_elemsize == 1) {
                    if (0 < iVar4) {
                      lVar5 = (long)local_dc;
                      __src_00 = (void *)((long)local_158.data +
                                         local_40 + lVar5 * local_38 * (long)local_f8);
                      iVar9 = 0;
                      do {
                        if ((int)uVar8 < 0xc) {
                          if (0 < (int)uVar8) {
                            uVar7 = 0;
                            do {
                              *(undefined1 *)((long)pvVar10 + uVar7) =
                                   *(undefined1 *)((long)__src_00 + uVar7);
                              uVar7 = uVar7 + 1;
                            } while (uVar8 != uVar7);
                          }
                        }
                        else {
                          memcpy(pvVar10,__src_00,(ulong)uVar8);
                        }
                        pvVar10 = (void *)((long)pvVar10 + (long)(int)uVar8);
                        __src_00 = (void *)((long)__src_00 + lVar5);
                        iVar9 = iVar9 + 1;
                      } while (iVar9 != iVar4);
                    }
                    _elemsize = local_b8;
                    this_00 = local_58;
                    if (local_b8 == 4) goto LAB_001bd135;
                    if (local_b8 == 2) goto LAB_001bd115;
                  }
                  pOVar12 = local_110;
                  piVar2 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
                  if (piVar2 != (int *)0x0) {
                    LOCK();
                    *piVar2 = *piVar2 + -1;
                    UNLOCK();
                    if (*piVar2 == 0) {
                      if (local_a8.allocator == (Allocator *)0x0) {
                        if (local_a8.data != (void *)0x0) {
                          free(local_a8.data);
                        }
                      }
                      else {
                        (*(local_a8.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_a8.cstep = 0;
                  local_a8.data = (void *)0x0;
                  local_a8.refcount._0_4_ = 0;
                  local_a8.refcount._4_4_ = 0;
                  local_a8.elemsize._0_4_ = 0;
                  local_a8.elemsize._4_4_ = 0;
                  local_a8.elempack = 0;
                  local_a8.dims = 0;
                  local_a8.w = 0;
                  local_a8.h = 0;
                  local_a8.d = 0;
                  local_a8.c = 0;
                  piVar2 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
                  if (piVar2 != (int *)0x0) {
                    LOCK();
                    *piVar2 = *piVar2 + -1;
                    UNLOCK();
                    if (*piVar2 == 0) {
                      if (local_158.allocator == (Allocator *)0x0) {
                        if (local_158.data != (void *)0x0) {
                          free(local_158.data);
                        }
                      }
                      else {
                        (*(local_158.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_158.cstep = 0;
                  local_158.data = (void *)0x0;
                  local_158.refcount._0_4_ = 0;
                  local_158.refcount._4_4_ = 0;
                  local_158.elemsize._0_4_ = 0;
                  local_158.elemsize._4_4_ = 0;
                  local_158.elempack = 0;
                  local_158.dims = 0;
                  local_158.w = 0;
                  local_158.h = 0;
                  local_158.d = 0;
                  local_158.c = 0;
                  pOVar12 = (Option *)&pOVar12->field_0x1;
                } while (pOVar12 != (Option *)local_50);
              }
              local_160 = local_160 + 1;
            } while (local_160 != local_48);
          }
          iVar4 = 0;
        }
      }
      else {
        Mat::clone(&local_158,(__fn *)&local_108,(void *)0x0,(int)local_108,(void *)(ulong)local_168
                  );
        if (this_00 != &local_158) {
          piVar2 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + 1;
            UNLOCK();
          }
          piVar2 = this_00->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (this_00->allocator == (Allocator *)0x0) {
                if (this_00->data != (void *)0x0) {
                  free(this_00->data);
                }
              }
              else {
                (*this_00->allocator->_vptr_Allocator[3])();
              }
            }
          }
          this_00->cstep = 0;
          this_00->data = (void *)0x0;
          this_00->refcount = (int *)0x0;
          *(undefined8 *)((long)&this_00->refcount + 4) = 0;
          *(undefined8 *)((long)&this_00->elemsize + 4) = 0;
          this_00->dims = 0;
          this_00->w = 0;
          this_00->h = 0;
          this_00->d = 0;
          this_00->c = 0;
          this_00->data = local_158.data;
          this_00->refcount = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
          this_00->elemsize = CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
          this_00->elempack = local_158.elempack;
          this_00->allocator = local_158.allocator;
          this_00->dims = local_158.dims;
          this_00->w = local_158.w;
          this_00->h = local_158.h;
          this_00->d = local_158.d;
          this_00->c = local_158.c;
          this_00->cstep = local_158.cstep;
        }
        piVar2 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (local_158.allocator == (Allocator *)0x0) {
              if (local_158.data != (void *)0x0) {
                free(local_158.data);
              }
            }
            else {
              (*(local_158.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (this_00->data == (void *)0x0) {
          iVar4 = -100;
        }
        else {
          iVar4 = -100;
          if ((long)this_00->c * this_00->cstep != 0) {
            iVar4 = 0;
          }
        }
      }
      if (local_100 == (int *)0x0) {
        return iVar4;
      }
      LOCK();
      *local_100 = *local_100 + -1;
      UNLOCK();
      if (*local_100 != 0) {
        return iVar4;
      }
      if (local_e8 != (Allocator *)0x0) {
        (*local_e8->_vptr_Allocator[3])();
        return iVar4;
      }
      goto LAB_001bd4f9;
    }
LAB_001bc661:
    if (this_00 == src) {
      return 0;
    }
    goto LAB_001bc68e;
  default:
    goto LAB_001bd2b0;
  }
  if (this_00 == src) {
    return 0;
  }
LAB_001bc68e:
  piVar2 = src->refcount;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
  }
  piVar2 = this_00->refcount;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (this_00->allocator == (Allocator *)0x0) {
        if (this_00->data != (void *)0x0) {
          free(this_00->data);
        }
      }
      else {
        (*this_00->allocator->_vptr_Allocator[3])();
      }
    }
  }
  this_00->cstep = 0;
  this_00->data = (void *)0x0;
  this_00->refcount = (int *)0x0;
  *(undefined8 *)((long)&this_00->refcount + 4) = 0;
  *(undefined8 *)((long)&this_00->elemsize + 4) = 0;
  this_00->dims = 0;
  this_00->w = 0;
  this_00->h = 0;
  this_00->d = 0;
  this_00->c = 0;
  piVar2 = src->refcount;
  this_00->data = src->data;
  this_00->refcount = piVar2;
  this_00->elemsize = src->elemsize;
  this_00->elempack = src->elempack;
  this_00->allocator = src->allocator;
  iVar4 = src->w;
  iVar9 = src->h;
  iVar1 = src->d;
  this_00->dims = src->dims;
  this_00->w = iVar4;
  this_00->h = iVar9;
  this_00->d = iVar1;
  this_00->c = src->c;
  this_00->cstep = src->cstep;
LAB_001bd2b0:
  return 0;
}

Assistant:

int Crop::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    Mat& top_blob = top_blobs[0];

    int _woffset, _hoffset, _doffset, _coffset = -1;
    int _outw = -1, _outh = -1, _outd = -1, _outc;
    if (woffset == -233)
    {
        resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);

        return 0;
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);

        return 0;
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            if (elemsize == 2)
                copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
            if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }

        return 0;
    }

    if (dims == 4)
    {
        if (_outw == w && _outh == h && _outd == d && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h && _outd == d)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outd, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            for (int z = 0; z < _outd; z++)
            {
                const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                Mat borderm = top_blob.channel(q).depth(z);

                if (elemsize == 1)
                    copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
                if (elemsize == 2)
                    copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
                if (elemsize == 4)
                    copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
            }
        }

        return 0;
    }

    return 0;
}